

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O0

int wstran_pipe_init(void *arg,nni_pipe *pipe)

{
  ws_pipe *p;
  nni_pipe *pipe_local;
  void *arg_local;
  
  *(nni_pipe **)((long)arg + 0x3d8) = pipe;
  nni_mtx_init((nni_mtx *)arg);
  nni_aio_init((nni_aio *)((long)arg + 0x40),wstran_pipe_send_cb,arg);
  nni_aio_init((nni_aio *)((long)arg + 0x208),wstran_pipe_recv_cb,arg);
  return 0;
}

Assistant:

static int
wstran_pipe_init(void *arg, nni_pipe *pipe)
{
	ws_pipe *p = arg;

	p->npipe = pipe;
	nni_mtx_init(&p->mtx);

	// Initialize AIOs.
	nni_aio_init(&p->txaio, wstran_pipe_send_cb, p);
	nni_aio_init(&p->rxaio, wstran_pipe_recv_cb, p);
	return (0);
}